

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O1

string * wasm::read_possible_response_file(string *__return_storage_ptr__,string *input)

{
  size_type sVar1;
  pointer pcVar2;
  BinaryOption binary;
  long *local_38 [2];
  long local_28 [2];
  
  sVar1 = input->_M_string_length;
  if ((sVar1 == 0) || (*(input->_M_dataplus)._M_p != '@')) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (input->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + sVar1);
  }
  else {
    binary = ~Binary;
    std::__cxx11::string::substr((ulong)local_38,(ulong)input);
    read_file<std::__cxx11::string>(__return_storage_ptr__,(wasm *)local_38,(string *)0x1,binary);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string wasm::read_possible_response_file(const std::string& input) {
  if (input.size() == 0 || input[0] != '@') {
    return input;
  }
  return wasm::read_file<std::string>(input.substr(1), Flags::Text);
}